

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O2

int __thiscall SPSUnit::hrd_parameters(SPSUnit *this,HRDParams *params)

{
  BitStreamReader *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  size_t SchedSelIdx;
  ulong uVar4;
  
  uVar2 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
  params->cpb_cnt_minus1 = uVar2;
  iVar3 = 1;
  if (uVar2 < 0x20) {
    this_00 = &(this->super_NALUnit).bitReader;
    uVar2 = BitStreamReader::getBits(this_00,4);
    params->bit_rate_scale = (uint8_t)uVar2;
    uVar2 = BitStreamReader::getBits(this_00,4);
    params->cpb_size_scale = (uint8_t)uVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&params->bit_rate_value_minus1,(ulong)(params->cpb_cnt_minus1 + 1));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&params->cpb_size_value_minus1,(ulong)(params->cpb_cnt_minus1 + 1));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&params->cbr_flag,(ulong)(params->cpb_cnt_minus1 + 1));
    for (uVar4 = 0; uVar4 <= params->cpb_cnt_minus1; uVar4 = uVar4 + 1) {
      uVar2 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
      (params->bit_rate_value_minus1).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = uVar2;
      if (uVar2 == 0xffffffff) {
        return 1;
      }
      uVar2 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
      (params->cpb_size_value_minus1).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = uVar2;
      if (uVar2 == 0xffffffff) {
        return 1;
      }
      bVar1 = BitStreamReader::getBit(this_00);
      (params->cbr_flag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = bVar1;
    }
    uVar2 = BitStreamReader::getBits(this_00,5);
    params->initial_cpb_removal_delay_length_minus1 = (uint8_t)uVar2;
    uVar2 = BitStreamReader::getBits(this_00,5);
    params->cpb_removal_delay_length_minus1 = (uint8_t)uVar2;
    uVar2 = BitStreamReader::getBits(this_00,5);
    params->dpb_output_delay_length_minus1 = (uint8_t)uVar2;
    uVar2 = BitStreamReader::getBits(this_00,5);
    params->time_offset_length = (uint8_t)uVar2;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int SPSUnit::hrd_parameters(HRDParams& params)
{
    params.cpb_cnt_minus1 = extractUEGolombCode();
    if (params.cpb_cnt_minus1 >= 32)
        return 1;
    params.bit_rate_scale = bitReader.getBits<uint8_t>(4);
    params.cpb_size_scale = bitReader.getBits<uint8_t>(4);

    params.bit_rate_value_minus1.resize(params.cpb_cnt_minus1 + 1);
    params.cpb_size_value_minus1.resize(params.cpb_cnt_minus1 + 1);
    params.cbr_flag.resize(params.cpb_cnt_minus1 + 1);

    for (size_t SchedSelIdx = 0; SchedSelIdx <= params.cpb_cnt_minus1; SchedSelIdx++)
    {
        params.bit_rate_value_minus1[SchedSelIdx] = extractUEGolombCode();
        if (params.bit_rate_value_minus1[SchedSelIdx] == UINT_MAX)
            return 1;
        params.cpb_size_value_minus1[SchedSelIdx] = extractUEGolombCode();
        if (params.cpb_size_value_minus1[SchedSelIdx] == UINT_MAX)
            return 1;
        params.cbr_flag[SchedSelIdx] = bitReader.getBit();
    }
    params.initial_cpb_removal_delay_length_minus1 = bitReader.getBits<uint8_t>(5);
    params.cpb_removal_delay_length_minus1 = bitReader.getBits<uint8_t>(5);
    params.dpb_output_delay_length_minus1 = bitReader.getBits<uint8_t>(5);
    params.time_offset_length = bitReader.getBits<uint8_t>(5);

    return 0;
}